

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O2

QSurfaceFormat
q_glFormatFromConfig(EGLDisplay display,EGLConfig config,QSurfaceFormat *referenceFormat)

{
  RenderableType RVar1;
  RenderableType RVar2;
  OpenGLModuleType OVar3;
  int interval;
  char *pcVar4;
  QSurfaceFormat *in_RCX;
  long in_FS_OFFSET;
  EGLint renderableType;
  EGLint sampleCount;
  EGLint stencilSize;
  EGLint depthSize;
  EGLint alphaSize;
  EGLint blueSize;
  EGLint greenSize;
  EGLint redSize;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)display = &DAT_aaaaaaaaaaaaaaaa;
  QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)display);
  redSize = 0;
  greenSize = 0;
  blueSize = 0;
  alphaSize = 0;
  depthSize = 0;
  stencilSize = 0;
  sampleCount = 0;
  renderableType = 0;
  eglGetConfigAttrib(config,referenceFormat,0x3024);
  eglGetConfigAttrib(config,referenceFormat,0x3023,&greenSize);
  eglGetConfigAttrib(config,referenceFormat,0x3022,&blueSize);
  eglGetConfigAttrib(config,referenceFormat,0x3021,&alphaSize);
  eglGetConfigAttrib(config,referenceFormat,0x3025,&depthSize);
  eglGetConfigAttrib(config,referenceFormat,0x3026,&stencilSize);
  eglGetConfigAttrib(config,referenceFormat,0x3031,&sampleCount);
  eglGetConfigAttrib(config,referenceFormat,0x3040,&renderableType);
  RVar1 = QSurfaceFormat::renderableType(in_RCX);
  if ((RVar1 == OpenVG) && ((renderableType & 2U) != 0)) {
    RVar1 = OpenVG;
  }
  else {
    RVar2 = QSurfaceFormat::renderableType(in_RCX);
    RVar1 = OpenGL;
    if ((RVar2 != OpenGL) || ((renderableType & 8U) == 0)) {
      RVar2 = QSurfaceFormat::renderableType(in_RCX);
      if ((RVar2 == DefaultRenderableType) &&
         (OVar3 = QOpenGLContext::openGLModuleType(), OVar3 == LibGL)) {
        pcVar4 = (char *)eglQueryString(config,0x3053);
        pcVar4 = strstr(pcVar4,"NVIDIA");
        if ((pcVar4 == (char *)0x0) && ((renderableType & 8U) != 0)) goto LAB_004f3256;
      }
      RVar1 = OpenGLES;
    }
  }
LAB_004f3256:
  QSurfaceFormat::setRenderableType((QSurfaceFormat *)display,RVar1);
  QSurfaceFormat::setRedBufferSize((QSurfaceFormat *)display,redSize);
  QSurfaceFormat::setGreenBufferSize((QSurfaceFormat *)display,greenSize);
  QSurfaceFormat::setBlueBufferSize((QSurfaceFormat *)display,blueSize);
  QSurfaceFormat::setAlphaBufferSize((QSurfaceFormat *)display,alphaSize);
  QSurfaceFormat::setDepthBufferSize((QSurfaceFormat *)display,depthSize);
  QSurfaceFormat::setStencilBufferSize((QSurfaceFormat *)display,stencilSize);
  QSurfaceFormat::setSamples((QSurfaceFormat *)display,sampleCount);
  QSurfaceFormat::setStereo((QSurfaceFormat *)display,false);
  interval = QSurfaceFormat::swapInterval(in_RCX);
  QSurfaceFormat::setSwapInterval((QSurfaceFormat *)display,interval);
  eglGetError();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSurfaceFormat)(QSurfaceFormatPrivate *)display;
}

Assistant:

QSurfaceFormat q_glFormatFromConfig(EGLDisplay display, const EGLConfig config, const QSurfaceFormat &referenceFormat)
{
    QSurfaceFormat format;
    EGLint redSize     = 0;
    EGLint greenSize   = 0;
    EGLint blueSize    = 0;
    EGLint alphaSize   = 0;
    EGLint depthSize   = 0;
    EGLint stencilSize = 0;
    EGLint sampleCount = 0;
    EGLint renderableType = 0;

    eglGetConfigAttrib(display, config, EGL_RED_SIZE,     &redSize);
    eglGetConfigAttrib(display, config, EGL_GREEN_SIZE,   &greenSize);
    eglGetConfigAttrib(display, config, EGL_BLUE_SIZE,    &blueSize);
    eglGetConfigAttrib(display, config, EGL_ALPHA_SIZE,   &alphaSize);
    eglGetConfigAttrib(display, config, EGL_DEPTH_SIZE,   &depthSize);
    eglGetConfigAttrib(display, config, EGL_STENCIL_SIZE, &stencilSize);
    eglGetConfigAttrib(display, config, EGL_SAMPLES,      &sampleCount);
    eglGetConfigAttrib(display, config, EGL_RENDERABLE_TYPE, &renderableType);

    if (referenceFormat.renderableType() == QSurfaceFormat::OpenVG && (renderableType & EGL_OPENVG_BIT))
        format.setRenderableType(QSurfaceFormat::OpenVG);
#ifdef EGL_VERSION_1_4
    else if (referenceFormat.renderableType() == QSurfaceFormat::OpenGL
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
    else if (referenceFormat.renderableType() == QSurfaceFormat::DefaultRenderableType
#ifndef QT_NO_OPENGL
             && QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
             && !strstr(eglQueryString(display, EGL_VENDOR), "NVIDIA")
#endif
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
#endif
    else
        format.setRenderableType(QSurfaceFormat::OpenGLES);

    format.setRedBufferSize(redSize);
    format.setGreenBufferSize(greenSize);
    format.setBlueBufferSize(blueSize);
    format.setAlphaBufferSize(alphaSize);
    format.setDepthBufferSize(depthSize);
    format.setStencilBufferSize(stencilSize);
    format.setSamples(sampleCount);
    format.setStereo(false);         // EGL doesn't support stereo buffers
    format.setSwapInterval(referenceFormat.swapInterval());

    // Clear the EGL error state because some of the above may
    // have errored out because the attribute is not applicable
    // to the surface type.  Such errors don't matter.
    eglGetError();

    return format;
}